

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v8::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  type size;
  char *pcVar5;
  anon_class_8_1_54a39806 decode;
  anon_class_8_1_54a39806 local_40;
  char local_38 [8];
  
  uVar4 = s.size_;
  pcVar5 = s.data_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (wchar_t *)0x0;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_0015bcd8;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar3 = pcVar5;
  local_40.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if ((3 < uVar4) && (pcVar5 < pcVar5 + (uVar4 - 3))) {
    do {
      pcVar3 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/include/spdlog/fmt/bundled/format-inl.h:2528:25)>
               ::anon_class_8_1_54a39806::operator()(&local_40,pcVar3);
    } while (pcVar3 < pcVar5 + (uVar4 - 3));
  }
  pcVar5 = pcVar5 + (uVar4 - (long)pcVar3);
  if (pcVar5 != (char *)0x0) {
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    memcpy(local_38,pcVar3,(size_t)pcVar5);
    pcVar3 = local_38;
    do {
      pcVar3 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/include/spdlog/fmt/bundled/format-inl.h:2528:25)>
               ::anon_class_8_1_54a39806::operator()(&local_40,pcVar3);
    } while ((long)pcVar3 - (long)local_38 < (long)pcVar5);
  }
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ <
      (this->buffer_).super_buffer<wchar_t>.size_ + 1) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
  (this->buffer_).super_buffer<wchar_t>.size_ = sVar2 + 1;
  pwVar1[sVar2] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, int error) {
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
  });
  buffer_.push_back(0);
}